

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O1

void * getbuffer(lua_State *L,int index,size_t *sz)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  size_t sVar4;
  
  iVar1 = lua_type(L,index);
  if ((iVar1 == 2) || (iVar1 == 7)) {
    pvVar3 = lua_touserdata(L,index);
    sVar4 = luaL_checkinteger(L,index + 1);
    *sz = sVar4;
  }
  else {
    if (iVar1 == 4) {
      pcVar2 = lua_tolstring(L,index,sz);
      return pcVar2;
    }
    luaL_argerror(L,index,"Need a string or userdata");
    pvVar3 = (void *)0x0;
  }
  return pvVar3;
}

Assistant:

static const void *
getbuffer(lua_State *L, int index, size_t *sz) {
	const void * buffer = NULL;
	int t = lua_type(L, index);
	if (t == LUA_TSTRING) {
		buffer = lua_tolstring(L, index, sz);
	} else {
		if (t != LUA_TUSERDATA && t != LUA_TLIGHTUSERDATA) {
			luaL_argerror(L, index, "Need a string or userdata");
			return NULL;
		}
		buffer = lua_touserdata(L, index);
		*sz = luaL_checkinteger(L, index+1);
	}
	return buffer;
}